

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.c
# Opt level: O1

_Bool project(source origin,wchar_t rad,loc finish,wchar_t dam,wchar_t typ,wchar_t flg,
             wchar_t degrees_of_arc,uint8_t diameter_of_source,object *obj)

{
  ushort uVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  uint uVar4;
  chunk_conflict *pcVar5;
  player *p;
  anon_enum_32 aVar6;
  anon_union_8_4_b62eeb40_for_which aVar7;
  _Bool _Var8;
  _Bool _Var9;
  wchar_t wVar10;
  wchar_t wVar11;
  loc lVar12;
  square *psVar13;
  loc lVar14;
  loc_conflict lVar15;
  loc_conflict lVar16;
  monster *pmVar17;
  int iVar18;
  wchar_t wVar19;
  undefined4 in_register_00000014;
  ulong uVar20;
  byte bVar21;
  long lVar22;
  char cVar23;
  void *pvVar24;
  int iVar25;
  wchar_t wVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  loc_conflict lVar30;
  wchar_t x;
  ulong uVar31;
  loc_conflict lVar32;
  bool bVar33;
  source origin_00;
  source origin_01;
  source origin_02;
  source origin_03;
  source origin_04;
  _Bool did_hit;
  _Bool was_obvious;
  wchar_t local_1df4;
  ulong local_1df0;
  anon_enum_32 local_1de4;
  wchar_t y;
  int16_t local_1dd2;
  loc local_1dd0;
  ulong local_1dc8;
  void *local_1dc0;
  loc_conflict local_1db8;
  ulong local_1db0;
  uint local_1da8;
  int local_1da4;
  loc local_1da0;
  ulong local_1d98;
  anon_union_8_4_b62eeb40_for_which local_1d90;
  ulong local_1d88;
  ulong local_1d80;
  loc_conflict local_1d78;
  wchar_t local_1d6c;
  wchar_t local_1d68;
  int local_1d64;
  uint8_t *local_1d60;
  ulong local_1d58;
  ulong local_1d50;
  long local_1d48;
  long local_1d40;
  wchar_t distance_to_grid [256];
  loc blast_grid [256];
  _Bool player_sees_grid [256];
  loc path_grid [512];
  
  p = player;
  local_1d88 = CONCAT44(in_register_00000014,rad);
  origin_00.which = origin.which;
  local_1de4 = origin.what;
  uVar31 = (ulong)finish >> 0x20;
  local_1dd2 = player->timed[2];
  local_1d6c = dam;
  local_1dc0 = malloc((ulong)z_info->max_range * 4 + 4);
  handle_stuff(p);
  local_1df4 = typ;
  local_1db0 = uVar31;
  if ((flg & 1U) == 0) {
    origin_00._4_4_ = 0;
    origin_00.what = local_1de4;
    lVar12 = origin_get_loc(origin_00);
    local_1da0 = (loc)((ulong)lVar12 & 0xffffffff);
    local_1d98 = (ulong)lVar12 >> 0x20;
    if ((ulong)lVar12 >> 0x20 == 0xffffffff && lVar12.x == L'\xffffffff') {
      local_1da0 = (loc)((ulong)finish & 0xffffffff);
      local_1d98 = uVar31;
    }
  }
  else {
    flg = flg & 0xfffffffe;
    local_1da0 = (loc)((ulong)finish & 0xffffffff);
    local_1d98 = uVar31;
  }
  uVar31 = local_1d88;
  wVar26 = flg & 0xfffffbf8U | 6;
  if ((flg & 0x400U) == 0) {
    wVar26 = flg;
  }
  if (degrees_of_arc != L'\0') {
    wVar26 = flg;
  }
  wVar11 = (wchar_t)local_1d88;
  if (wVar11 == L'\0') {
    wVar26 = flg;
  }
  uVar27 = (ulong)(uint)wVar26;
  lVar12 = (loc)((ulong)local_1da0 | local_1d98 << 0x20);
  _Var8 = loc_eq((loc_conflict)lVar12,(loc_conflict)finish);
  uVar28 = local_1db0;
  pvVar24 = local_1dc0;
  local_1dc8 = uVar27;
  local_1d90 = origin_00.which;
  if (_Var8) {
    blast_grid[0].y = (wchar_t)local_1db0;
    distance_to_grid[0] = L'\0';
    local_1dd0 = finish;
    blast_grid[0].x = finish.x;
    psVar13 = square(cave,finish);
    flag_on_dbg(psVar13->info,3,0x12,"square(cave, finish)->info","SQUARE_PROJECT");
    local_1d80 = 0;
    uVar20 = 1;
  }
  else {
    wVar10 = project_path((chunk *)cave,path_grid,(uint)z_info->max_range,lVar12,finish,wVar26);
    local_1d80 = uVar31 & 0xffffffff;
    if (wVar10 < wVar11) {
      local_1d80 = (ulong)(uint)wVar10;
    }
    if ((wVar26 & 2U) == 0) {
      local_1d80 = (ulong)(uint)wVar10;
    }
    if (wVar11 < L'\x01') {
      local_1d80 = (ulong)(uint)wVar10;
    }
    uVar28 = local_1d98;
    if ((((uint)wVar26 >> 10 & 1) == 0) && (0 < (int)local_1d80)) {
      local_1d78.x = (int)local_1d80 - 1;
      local_1d78.y = 0;
      cVar23 = -1 < (char)wVar26 && local_1dd2 == 0;
      _y = (loc_conflict)(local_1d80 - 1);
      lVar16.x = 0;
      lVar16.y = 0;
      local_1da8 = (uint)(wVar26 & 2U) >> 1;
      local_1db8.x._0_1_ = (byte)local_1da8 | wVar11 < L'\x01';
      local_1df0 = 0;
      local_1dd0 = local_1da0;
      local_1da4 = CONCAT31(local_1da4._1_3_,cVar23);
      do {
        wVar26 = path_grid[(long)lVar16].x;
        lVar12.y = L'\0';
        lVar12.x = wVar26;
        wVar11 = path_grid[(long)lVar16].y;
        _Var8 = square_ispassable(cave,path_grid[(long)lVar16]);
        pcVar5 = cave;
        bVar21 = _Var8 | (byte)local_1db8.x;
        if (bVar21 == 1) {
          local_1db0 = uVar28;
          if (((local_1dc8 & 2) != 0) || (local_1d78 == lVar16)) {
            iVar18 = (int)local_1df0;
            blast_grid[iVar18].y = wVar11;
            blast_grid[iVar18].x = wVar26;
            distance_to_grid[iVar18] = L'\0';
            lVar14 = (loc)loc(wVar26,wVar11);
            psVar13 = square(pcVar5,lVar14);
            flag_on_dbg(psVar13->info,3,0x12,"square(cave, loc(x, y))->info","SQUARE_PROJECT");
            local_1df0 = (ulong)(iVar18 + 1);
            cVar23 = (char)local_1da4;
          }
          pcVar5 = cave;
          if (cVar23 != '\0') {
            lVar14 = (loc)loc(wVar26,wVar11);
            _Var8 = square_isview(pcVar5,lVar14);
            event_signal_bolt(EVENT_BOLT,local_1df4,false,_Var8,SUB41(local_1da8,0),
                              (wchar_t)local_1db0,local_1dd0.x,wVar11,wVar26);
          }
          uVar28 = (ulong)(uint)wVar11;
          local_1dd0 = lVar12;
        }
        bVar33 = _y != lVar16;
        lVar16 = (loc_conflict)((long)lVar16 + 1);
        uVar20 = local_1df0;
        pvVar24 = local_1dc0;
        uVar31 = local_1d88;
        uVar27 = local_1dc8;
      } while ((bVar21 & bVar33) != 0);
    }
    else {
      local_1dd0 = local_1da0;
      uVar20 = 0;
    }
  }
  iVar18 = (int)uVar31;
  if ((0 < iVar18) && ((uVar27 & 2) == 0)) {
    lVar22 = 0;
    if ((((uint)uVar27 >> 10 & 1) == 0) || (iVar25 = (int)local_1d80, iVar25 == 0)) {
      lVar29 = 0;
    }
    else {
      uVar31 = uVar31 & 0xffffffff;
      if (0x13 < iVar18) {
        uVar31 = 0x14;
      }
      iVar18 = iVar25 + -1;
      if (0x14 < iVar25) {
        iVar18 = 0x14;
      }
      lVar29 = (long)((path_grid[iVar18].y - (int)local_1d98) + 0x14);
      lVar22 = (long)((path_grid[iVar18].x - local_1da0.x) + 0x14);
      local_1dd0 = (loc)((ulong)local_1da0 & 0xffffffff);
      uVar28 = local_1d98;
    }
    wVar26 = (wchar_t)uVar28;
    if ((int)uVar20 == 0) {
      blast_grid[0].x = local_1dd0.x;
      distance_to_grid[0] = L'\0';
      blast_grid[0].y = wVar26;
      psVar13 = square(cave,(loc)((ulong)local_1dd0 & 0xffffffff | uVar28 << 0x20));
      flag_on_dbg(psVar13->info,3,0x12,"square(cave, centre)->info","SQUARE_PROJECT");
      uVar20 = 1;
    }
    iVar18 = (int)uVar31;
    lVar15.x = wVar26 - iVar18;
    if ((int)lVar15.x <= iVar18 + wVar26) {
      local_1da4 = local_1dd0.x - iVar18;
      local_1da8 = iVar18 + local_1dd0.x;
      _y = (loc_conflict)((ulong)local_1dd0 & 0xffffffff | uVar28 << 0x20);
      local_1d60 = get_angle_to_grid[lVar29] + lVar22;
      iVar25 = degrees_of_arc + L'\t';
      if (-1 < degrees_of_arc + L'\x06') {
        iVar25 = degrees_of_arc + L'\x06';
      }
      local_1d58 = (ulong)(uint)(iVar25 >> 2);
      local_1d48 = (long)local_1da4;
      local_1d78 = (loc_conflict)(long)(int)local_1da8;
      lVar15.y = 0;
      local_1d64 = iVar18 + 1 + wVar26;
      local_1d50 = local_1d80 & 0xffffffff;
      local_1db8 = lVar15;
      local_1db0 = uVar28;
      local_1d88 = uVar31;
      do {
        if (local_1da4 <= (int)local_1da8) {
          local_1d40 = (long)((local_1db8.x - (int)local_1d98) + 0x14);
          lVar22 = local_1d48;
          do {
            wVar26 = (wchar_t)lVar22;
            lVar12 = (loc)loc(wVar26,local_1db8.x);
            _Var8 = loc_eq((loc_conflict)lVar12,_y);
            if (_Var8) {
LAB_001add1b:
              bVar33 = false;
            }
            else {
              bVar33 = true;
              if ((int)uVar20 < 0xff) {
                _Var8 = square_in_bounds(cave,lVar12);
                if (!_Var8) goto LAB_001add1b;
                if (((uVar27 & 4) != 0) || (_Var8 = square_ispassable(cave,lVar12), _Var8)) {
                  _Var8 = square_isprojectable(cave,lVar12);
                  if (!_Var8) {
                    uVar31 = 0;
                    bVar33 = false;
                    local_1df0 = uVar20;
                    do {
                      lVar16 = loc_sum((loc_conflict)lVar12,(loc_conflict)ddgrid_ddd[uVar31]);
                      _Var8 = los(cave,_y,lVar16);
                      if (_Var8) {
                        bVar33 = true;
                      }
                      uVar20 = local_1df0;
                      uVar27 = local_1dc8;
                    } while ((uVar31 < 7) && (uVar31 = uVar31 + 1, !_Var8));
                    goto joined_r0x001addcd;
                  }
                }
                else {
                  bVar33 = square_isprojectable(cave,lVar12);
joined_r0x001addcd:
                  if (!bVar33) goto LAB_001add1b;
                }
                wVar11 = distance(_y,(loc_conflict)lVar12);
                uVar31 = local_1d50;
                if (wVar11 <= (wchar_t)local_1d88) {
                  local_1df0 = uVar20;
                  if ((int)local_1d80 < 1) {
                    bVar33 = false;
                  }
                  else {
                    uVar28 = 0;
                    bVar33 = false;
                    local_1d68 = wVar11;
                    do {
                      _Var8 = loc_eq((loc_conflict)lVar12,(loc_conflict)path_grid[uVar28]);
                      if (_Var8) {
                        bVar33 = true;
                      }
                      uVar28 = uVar28 + 1;
                      uVar27 = local_1dc8;
                      wVar11 = local_1d68;
                    } while (uVar31 != uVar28);
                  }
                  if (((uint)uVar27 >> 10 & 1) != 0) {
                    iVar18 = (uint)get_angle_to_grid[local_1d40][(wVar26 - local_1da0.x) + 0x14] -
                             (uint)*local_1d60;
                    uVar4 = iVar18 + 0x5a;
                    if (iVar18 < -0x5a) {
                      uVar4 = -(iVar18 + 0x5a);
                    }
                    iVar18 = (uVar4 - 0x5a) + (uVar4 / 0xb4) * -0xb4;
                    if (uVar4 % 0xb4 < 0x5b) {
                      iVar18 = 0x5a - uVar4 % 0xb4;
                    }
                    uVar20 = local_1df0;
                    if ((int)local_1d58 <= iVar18 && !bVar33) goto LAB_001add1b;
                  }
                  _Var8 = los(cave,_y,(loc_conflict)lVar12);
                  uVar20 = local_1df0;
                  if (_Var8 || bVar33) {
                    iVar18 = (int)local_1df0;
                    blast_grid[iVar18].y = local_1db8.x;
                    blast_grid[iVar18].x = wVar26;
                    distance_to_grid[iVar18] = wVar11;
                    psVar13 = square(cave,lVar12);
                    flag_on_dbg(psVar13->info,3,0x12,"square(cave, grid)->info","SQUARE_PROJECT");
                    uVar20 = (ulong)(iVar18 + 1);
                  }
                }
                goto LAB_001add1b;
              }
            }
          } while ((!bVar33) && (bVar33 = lVar22 < (long)local_1d78, lVar22 = lVar22 + 1, bVar33));
        }
        local_1db8 = (loc_conflict)((long)local_1db8 + 1);
        pvVar24 = local_1dc0;
        uVar31 = local_1d88;
        uVar28 = local_1db0;
      } while (local_1d64 != local_1db8.x);
    }
  }
  uVar1 = z_info->max_range;
  wVar26 = (wchar_t)uVar31;
  lVar22 = 0;
  do {
    wVar11 = L'\0';
    if (lVar22 <= wVar26) {
      iVar18 = (int)lVar22;
      if (diameter_of_source == '\0' || lVar22 == 0) {
        wVar11 = (local_1d6c + iVar18) / (iVar18 + 1);
      }
      else {
        wVar11 = ((uint)diameter_of_source * local_1d6c) / (iVar18 + 1);
        if ((uint)local_1d6c <= (uint)wVar11) {
          wVar11 = local_1d6c;
        }
      }
    }
    *(wchar_t *)((long)pvVar24 + lVar22 * 4) = wVar11;
    lVar22 = lVar22 + 1;
  } while ((ulong)uVar1 + 1 != lVar22);
  wVar11 = (wchar_t)uVar20;
  if (L'\xffffffff' < wVar26) {
    wVar19 = L'\0';
    wVar10 = L'\0';
    do {
      if (wVar19 < wVar11) {
        lVar22 = (long)wVar19;
        do {
          wVar2 = distance_to_grid[lVar22];
          if (wVar2 == wVar10) {
            wVar3 = distance_to_grid[wVar19];
            lVar12 = blast_grid[wVar19];
            blast_grid[wVar19] = blast_grid[lVar22];
            distance_to_grid[wVar19] = wVar2;
            blast_grid[lVar22] = lVar12;
            distance_to_grid[lVar22] = wVar3;
            wVar19 = wVar19 + L'\x01';
          }
          lVar22 = lVar22 + 1;
        } while (wVar11 != lVar22);
      }
      bVar33 = wVar10 != wVar26;
      wVar10 = wVar10 + L'\x01';
    } while (bVar33);
  }
  local_1db0 = uVar28;
  if (L'\0' < wVar11) {
    uVar31 = 0;
    do {
      _Var8 = panel_contains(blast_grid[uVar31].y,blast_grid[uVar31].x);
      if ((((!_Var8) || (_Var8 = square_isview(cave,blast_grid[uVar31]), !_Var8)) ||
          (local_1dd2 != 0)) || (_Var8 = true, (uVar27 & 0x80) != 0)) {
        _Var8 = false;
      }
      player_sees_grid[uVar31] = _Var8;
      uVar31 = uVar31 + 1;
    } while ((uVar20 & 0xffffffff) != uVar31);
  }
  event_signal_blast(EVENT_EXPLOSION,local_1df4,wVar11,distance_to_grid,false,player_sees_grid,
                     (loc_conflict *)blast_grid,
                     (loc_conflict)((ulong)local_1dd0 & 0xffffffff | local_1db0 << 0x20));
  aVar7 = local_1d90;
  aVar6 = local_1de4;
  wVar26 = local_1df4;
  _Var8 = false;
  local_1df0 = uVar20;
  if (((uVar27 & 0x20) != 0) && (_Var8 = false, L'\0' < wVar11)) {
    _y = (loc_conflict)(uVar20 & 0xffffffff);
    lVar32.x = 0;
    lVar32.y = 0;
    _Var8 = false;
    do {
      origin_01._4_4_ = 0;
      origin_01.what = aVar6;
      origin_01.which.trap = aVar7.trap;
      _Var9 = project_o(origin_01,distance_to_grid[(long)lVar32],
                        (loc_conflict)blast_grid[(long)lVar32],
                        *(wchar_t *)((long)local_1dc0 + (long)distance_to_grid[(long)lVar32] * 4),
                        wVar26,obj);
      if (_Var9) {
        _Var8 = true;
      }
      lVar32 = (loc_conflict)((long)lVar32 + 1);
    } while (_y != lVar32);
  }
  uVar31 = local_1dc8;
  if ((local_1dc8 & 0x40) != 0) {
    iVar18 = 0;
    bVar33 = false;
    was_obvious = false;
    did_hit = false;
    lVar16 = loc(0,0);
    _y = (loc_conflict)((ulong)lVar16 >> 0x20);
    if (0 < (int)local_1df0) {
      uVar31 = local_1df0 & 0xffffffff;
      uVar27 = 0;
      local_1db8 = lVar16;
      do {
        _Var9 = square_isproject(cave,blast_grid[uVar27]);
        if ((_Var9) &&
           (pmVar17 = square_monster(cave,blast_grid[uVar27]), pmVar17 != (monster *)0x0)) {
          origin_02._4_4_ = 0;
          origin_02.what = local_1de4;
          origin_02.which.trap = local_1d90.trap;
          project_m(origin_02,distance_to_grid[uVar27],(loc_conflict)blast_grid[uVar27],
                    *(wchar_t *)((long)local_1dc0 + (long)distance_to_grid[uVar27] * 4),local_1df4,
                    (wchar_t)local_1dc8,&did_hit,&was_obvious);
          if (was_obvious != false) {
            _Var8 = true;
          }
          if (did_hit == true) {
            iVar18 = iVar18 + 1;
            local_1db8.y = 0;
            local_1db8.x = (pmVar17->grid).x;
            register0x00000004 = 0;
            y = (pmVar17->grid).y;
          }
        }
        uVar27 = uVar27 + 1;
      } while (uVar31 != uVar27);
      bVar33 = iVar18 == 1;
      uVar31 = local_1dc8;
      lVar16 = local_1db8;
    }
    pcVar5 = cave;
    if ((bool)(local_1de4 == SRC_PLAYER & bVar33)) {
      lVar12 = (loc)loc(lVar16.x,y);
      psVar13 = square(pcVar5,lVar12);
      pcVar5 = cave;
      if (0 < psVar13->mon) {
        lVar12 = (loc)loc(lVar16.x,y);
        pmVar17 = square_monster(pcVar5,lVar12);
        _Var9 = monster_is_visible(pmVar17);
        if (_Var9) {
          monster_race_track(player->upkeep,pmVar17->race);
          health_track(player->upkeep,pmVar17);
        }
      }
    }
  }
  wVar26 = local_1df4;
  if (((uint)uVar31 >> 0xb & 1) != 0) {
    wVar11 = L'\0';
    if (local_1de4 == SRC_MONSTER) {
      pmVar17 = cave_monster(cave,local_1d90.monster);
      wVar10 = pmVar17->race->spell_power;
      _Var9 = monster_is_powerful(pmVar17);
      wVar11 = L'P';
      if (L'P' < wVar10) {
        wVar11 = wVar10;
      }
      if (!_Var9) {
        wVar11 = wVar10;
      }
    }
    if ((int)local_1df0 < 1) {
      bVar33 = true;
    }
    else {
      uVar28 = local_1df0 & 0xffffffff;
      uVar27 = 0;
      do {
        origin_03._4_4_ = 0;
        origin_03.what = local_1de4;
        origin_03.which.trap = local_1d90.trap;
        _Var9 = project_p(origin_03,distance_to_grid[uVar27],blast_grid[uVar27],
                          *(wchar_t *)((long)local_1dc0 + (long)distance_to_grid[uVar27] * 4),
                          local_1df4,wVar11,(_Bool)((byte)((uint)uVar31 >> 0xe) & 1));
        if (_Var9) {
          _Var8 = true;
          if (player->is_dead == true) {
            free(local_1dc0);
            bVar33 = false;
            uVar31 = local_1dc8;
            wVar26 = local_1df4;
            goto LAB_001ae3f0;
          }
          break;
        }
        uVar27 = uVar27 + 1;
      } while (uVar28 != uVar27);
      bVar33 = true;
      uVar31 = local_1dc8;
      wVar26 = local_1df4;
    }
LAB_001ae3f0:
    if (!bVar33) {
      return true;
    }
  }
  aVar7 = local_1d90;
  pvVar24 = local_1dc0;
  aVar6 = local_1de4;
  if (((uVar31 & 0x10) != 0) && (0 < (int)local_1df0)) {
    _y = (loc_conflict)(local_1df0 & 0xffffffff);
    lVar30.x = 0;
    lVar30.y = 0;
    do {
      origin_04._4_4_ = 0;
      origin_04.what = aVar6;
      origin_04.which.trap = aVar7.trap;
      _Var9 = project_f(origin_04,distance_to_grid[(long)lVar30],blast_grid[(long)lVar30],
                        *(wchar_t *)((long)pvVar24 + (long)distance_to_grid[(long)lVar30] * 4),
                        wVar26);
      if (_Var9) {
        _Var8 = true;
      }
      lVar30 = (loc_conflict)((long)lVar30 + 1);
    } while (_y != lVar30);
  }
  if (0 < (int)local_1df0) {
    uVar31 = local_1df0 & 0xffffffff;
    uVar27 = 0;
    do {
      psVar13 = square(cave,blast_grid[uVar27]);
      flag_off(psVar13->info,3,0x12);
      uVar27 = uVar27 + 1;
    } while (uVar31 != uVar27);
  }
  if (player->upkeep->update != 0) {
    update_stuff(player);
  }
  free(local_1dc0);
  return _Var8;
}

Assistant:

bool project(struct source origin, int rad, struct loc finish,
			 int dam, int typ, int flg,
			 int degrees_of_arc, uint8_t diameter_of_source,
			 const struct object *obj)
{
	int i, j, k, dist_from_centre;

	uint32_t dam_temp;

	struct loc centre;
	struct loc start;

	int n1y = 0;
	int n1x = 0;

	/* Assume the player sees nothing */
	bool notice = false;

	/* Notify the UI if it can draw this projection */
	bool drawing = false;

	/* Is the player blind? */
	bool blind = (player->timed[TMD_BLIND] ? true : false);

	/* Number of grids in the "path" */
	int num_path_grids = 0;

	/* Actual grids in the "path" */
	struct loc path_grid[512];

	/* Number of grids in the "blast area" (including the "beam" path) */
	int num_grids = 0;

	/* Coordinates of the affected grids */
	struct loc blast_grid[256];

	/* Distance to each of the affected grids. */
	int distance_to_grid[256];

	/* Player visibility of each of the affected grids. */
	bool player_sees_grid[256];

	/* Precalculated damage values for each distance. */
	int *dam_at_dist = malloc((z_info->max_range + 1) * sizeof(*dam_at_dist));

	/* Flush any pending output */
	handle_stuff(player);

	/* No projection path - jump to target */
	if (flg & PROJECT_JUMP) {
		start = finish;

		/* Clear the flag */
		flg &= ~(PROJECT_JUMP);
	} else {
		start = origin_get_loc(origin);

		/* Default to finish grid */
		if (start.y == -1 && start.x == -1) {
			start = finish;
		}
	}

	/* Default center of explosion (if any) */
	centre = start;

	/*
	 * An arc spell with no width and a non-zero radius is actually a
	 * beam of defined length.  Mark it as such.
	 */
	if ((flg & (PROJECT_ARC)) && (degrees_of_arc == 0) && (rad != 0)) {
		/* No longer an arc */
		flg &= ~(PROJECT_ARC);

		/* Now considered a beam */
		flg |= (PROJECT_BEAM);
		flg |= (PROJECT_THRU);
	}

	/*
	 * If a single grid is both start and finish (for example
	 * if PROJECT_JUMP is set), store it; otherwise, travel along the
	 * projection path.
	 */
	if (loc_eq(start, finish)) {
		blast_grid[num_grids] =  finish;
		centre = finish;
		distance_to_grid[num_grids] = 0;
		sqinfo_on(square(cave, finish)->info, SQUARE_PROJECT);
		num_grids++;
	} else {
		/* Start from caster */
		int y = start.y;
		int x = start.x;

		/* Calculate the projection path */
		num_path_grids = project_path(cave, path_grid,
			z_info->max_range, start, finish, flg);

		/* Some beams have limited length. */
		if (flg & (PROJECT_BEAM)) {
			/* Use length limit, if any is given. */
			if ((rad > 0) && (rad < num_path_grids)) {
				num_path_grids = rad;
			}
		}


		/* Project along the path (except for arcs) */
		if (!(flg & (PROJECT_ARC))) {
			for (i = 0; i < num_path_grids; ++i) {
				int oy = y;
				int ox = x;

				int ny = path_grid[i].y;
				int nx = path_grid[i].x;

				/* Hack -- Balls explode before reaching walls. */
				if (!square_ispassable(cave, path_grid[i]) && (rad > 0) &&
					!(flg & (PROJECT_BEAM)))
					break;

				/* Advance */
				y = ny;
				x = nx;

				/* Beams collect all grids in the path, all other methods
				 * collect only the final grid in the path. */
				if (flg & (PROJECT_BEAM)) {
					blast_grid[num_grids].y = y;
					blast_grid[num_grids].x = x;
					distance_to_grid[num_grids] = 0;
					sqinfo_on(square(cave, loc(x, y))->info, SQUARE_PROJECT);
					num_grids++;
				} else if (i == num_path_grids - 1) {
					blast_grid[num_grids].y = y;
					blast_grid[num_grids].x = x;
					distance_to_grid[num_grids] = 0;
					sqinfo_on(square(cave, loc(x, y))->info, SQUARE_PROJECT);
					num_grids++;
				}

				/* Only do visuals if requested and within range limit. */
				if (!blind && !(flg & (PROJECT_HIDE))) {
					bool seen = square_isview(cave, loc(x, y));
					bool beam = flg & (PROJECT_BEAM);

					/* Tell the UI to display the bolt */
					event_signal_bolt(EVENT_BOLT, typ, drawing, seen, beam, oy,
									  ox, y, x);
				}
			}
		}

		/* Save the "blast epicenter" */
		centre.y = y;
		centre.x = x;
	}

	/* Now check for explosions.  Beams have already stored all the grids they
	 * will affect; all non-beam projections with positive radius explode in
	 * some way */
	if ((rad > 0) && (!(flg & (PROJECT_BEAM)))) {
		int y, x;

		/* Pre-calculate some things for arcs. */
		if ((flg & (PROJECT_ARC)) && (num_path_grids != 0)) {
			/* Explosion centers on the caster. */
			centre = start;

			/* The radius of arcs cannot be more than 20 */
			if (rad > 20)
				rad = 20;

			/* Ensure legal access into get_angle_to_grid table */
			if (num_path_grids < 21)
				i = num_path_grids - 1;
			else
				i = 20;

			/* Reorient the grid forming the end of the arc's centerline. */
			n1y = path_grid[i].y - centre.y + 20;
			n1x = path_grid[i].x - centre.x + 20;
		}

		/* If the explosion centre hasn't been saved already, save it now. */
		if (num_grids == 0) {
			blast_grid[num_grids] = centre;
			distance_to_grid[num_grids] = 0;
			sqinfo_on(square(cave, centre)->info, SQUARE_PROJECT);
			num_grids++;
		}

		/* Scan every grid that might possibly be in the blast radius. */
		for (y = centre.y - rad; y <= centre.y + rad; y++) {
			for (x = centre.x - rad; x <= centre.x + rad; x++) {
				struct loc grid = loc(x, y);
				bool on_path = false;

				/* Center grid has already been stored. */
				if (loc_eq(grid, centre))
					continue;

				/* Precaution: Stay within area limit. */
				if (num_grids >= 255)
					break;

				/* Ignore "illegal" locations */
				if (!square_in_bounds(cave, grid))
					continue;

				/* Most explosions are immediately stopped by walls. If
				 * PROJECT_THRU is set, walls can be affected if adjacent to
				 * a grid visible from the explosion centre - note that as of
				 * Angband 3.5.0 there are no such explosions - NRM.
				 * All explosions can affect one layer of terrain which is
				 * passable but not projectable */
				if ((flg & (PROJECT_THRU)) || square_ispassable(cave, grid)) {
					/* If this is a wall grid, ... */
					if (!square_isprojectable(cave, grid)) {
						bool can_see_one = false;
						/* Check neighbors */
						for (i = 0; i < 8; i++) {
							struct loc adj_grid = loc_sum(grid, ddgrid_ddd[i]);
							if (los(cave, centre, adj_grid)) {
								can_see_one = true;
								break;
							}
						}

						/* Require at least one adjacent grid in LOS. */
						if (!can_see_one)
							continue;
					}
				} else if (!square_isprojectable(cave, grid))
					continue;

				/* Must be within maximum distance. */
				dist_from_centre  = (distance(centre, grid));
				if (dist_from_centre > rad)
					continue;

				/* Mark grids which are on the projection path */
				for (i = 0; i < num_path_grids; i++) {
					if (loc_eq(grid, path_grid[i])) {
						on_path = true;
					}
				}

				/* Do we need to consider a restricted angle? */
				if (flg & (PROJECT_ARC)) {
					/* Use angle comparison to delineate an arc. */
					int n2y, n2x, tmp, rotate, diff;

					/* Reorient current grid for table access. */
					n2y = y - start.y + 20;
					n2x = x - start.x + 20;

					/* Find the angular difference (/2) between the lines to
					 * the end of the arc's center-line and to the current grid.
					 */
					rotate = 90 - get_angle_to_grid[n1y][n1x];
					tmp = ABS(get_angle_to_grid[n2y][n2x] + rotate) % 180;
					diff = ABS(90 - tmp);

					/* If difference is greater then that allowed, skip it,
					 * unless it's on the target path */
					if ((diff >= (degrees_of_arc + 6) / 4) && !on_path)
						continue;
				}

				/* Accept remaining grids if in LOS or on the projection path */
				if (los(cave, centre, grid) || on_path) {
					blast_grid[num_grids].y = y;
					blast_grid[num_grids].x = x;
					distance_to_grid[num_grids] = dist_from_centre;
					sqinfo_on(square(cave, grid)->info, SQUARE_PROJECT);
					num_grids++;
				}
			}
		}
	}

	/* Calculate and store the actual damage at each distance. */
	for (i = 0; i <= z_info->max_range; i++) {
		if (i > rad) {
			/* No damage outside the radius. */
			dam_temp = 0;
		} else if ((!diameter_of_source) || (i == 0)) {
			/* Standard damage calc. for 10' source diameters, or at origin. */
			dam_temp = (dam + i) / (i + 1);
		} else {
			/* If a particular diameter for the source of the explosion's
			 * energy is given, it is full strength to that diameter and
			 * then reduces */
			dam_temp = (diameter_of_source * dam) / (i + 1);
			if (dam_temp > (uint32_t) dam) {
				dam_temp = dam;
			}
		}

		/* Store it. */
		dam_at_dist[i] = dam_temp;
	}


	/* Sort the blast grids by distance from the centre. */
	for (i = 0, k = 0; i <= rad; i++) {
		/* Collect all the grids of a given distance together. */
		for (j = k; j < num_grids; j++) {
			if (distance_to_grid[j] == i) {
				struct loc tmp;
				int tmp_d = distance_to_grid[k];
				tmp = blast_grid[k];

				blast_grid[k] = blast_grid[j];
				distance_to_grid[k] = distance_to_grid[j];

				blast_grid[j] = tmp;
				distance_to_grid[j] = tmp_d;

				/* Write to next slot */
				k++;
			}
		}
	}

	/* Establish which grids are visible - no blast visuals with PROJECT_HIDE */
	for (i = 0; i < num_grids; i++) {
		if (panel_contains(blast_grid[i].y, blast_grid[i].x) &&
			square_isview(cave, blast_grid[i]) &&
			!blind && !(flg & (PROJECT_HIDE))) {
			player_sees_grid[i] = true;
		} else {
			player_sees_grid[i] = false;
		}
	}

	/* Tell the UI to display the blast */
	event_signal_blast(EVENT_EXPLOSION, typ, num_grids, distance_to_grid,
					   drawing, player_sees_grid, blast_grid, centre);

	/* Affect objects on every relevant grid */
	if (flg & (PROJECT_ITEM)) {
		for (i = 0; i < num_grids; i++) {
			if (project_o(origin, distance_to_grid[i], blast_grid[i],
						  dam_at_dist[distance_to_grid[i]], typ, obj)) {
				notice = true;
			}
		}
	}

	/* Check monsters */
	if (flg & (PROJECT_KILL)) {
		bool was_obvious = false;
		bool did_hit = false;
		int num_hit = 0;
		struct loc last_hit_grid = loc(0, 0);

		/* Scan for monsters */
		for (i = 0; i < num_grids; i++) {
			struct monster *mon = NULL;

			/* Check this monster hasn't been processed already */
			if (!square_isproject(cave, blast_grid[i]))
				continue;

			/* Check there is actually a monster here */
			mon = square_monster(cave, blast_grid[i]);
			if (mon == NULL)
				continue;

			/* Affect the monster in the grid */
			project_m(origin, distance_to_grid[i], blast_grid[i],
			          dam_at_dist[distance_to_grid[i]], typ, flg,
			          &did_hit, &was_obvious);
			if (was_obvious) {
				notice = true;
			}
			if (did_hit) {
				num_hit++;

				/* Monster location may have been updated by project_m() */
				last_hit_grid = mon->grid;
			}
		}

		/* Player affected one monster (without "jumping") */
		if (origin.what == SRC_PLAYER &&
				num_hit == 1 &&
				!(flg & PROJECT_JUMP)) {
			/* Location */
			int x = last_hit_grid.x;
			int y = last_hit_grid.y;

			/* Track if possible */
			if (square(cave, loc(x, y))->mon > 0) {
				struct monster *mon = square_monster(cave, loc(x, y));

				/* Recall and track */
				if (monster_is_visible(mon)) {
					monster_race_track(player->upkeep, mon->race);
					health_track(player->upkeep, mon);
				}
			}
		}
	}

	/* Look for the player, affect them when found */
	if (flg & (PROJECT_PLAY)) {
		/* Set power */
		int power = 0;
		if (origin.what == SRC_MONSTER) {
			struct monster *mon = cave_monster(cave, origin.which.monster);
			power = mon->race->spell_power;

			/* Breaths from powerful monsters get power effects as well */
			if (monster_is_powerful(mon))
				power = MAX(power, 80);
		}
		for (i = 0; i < num_grids; i++) {
			if (project_p(origin, distance_to_grid[i], blast_grid[i],
						  dam_at_dist[distance_to_grid[i]], typ, power,
						  flg & PROJECT_SELF)) {
				notice = true;
				if (player->is_dead) {
					free(dam_at_dist);
					return notice;
				}
				break;
			}
		}
	}

	/* Affect features in every relevant grid */
	if (flg & (PROJECT_GRID)) {
		for (i = 0; i < num_grids; i++) {
			if (project_f(origin, distance_to_grid[i], blast_grid[i],
						  dam_at_dist[distance_to_grid[i]], typ)) {
				notice = true;
			}
		}
	}

	/* Clear all the processing marks. */
	for (i = 0; i < num_grids; i++) {
		/* Clear the mark */
		sqinfo_off(square(cave, blast_grid[i])->info, SQUARE_PROJECT);
	}

	/* Update stuff if needed */
	if (player->upkeep->update) update_stuff(player);

	free(dam_at_dist);

	/* Return "something was noticed" */
	return (notice);
}